

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockRangeFactory.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::BlockRangeFactory::buildRanges(BlockRangeFactory *this,RangeTokenMap *rangeTokMap)

{
  short *psVar1;
  short *psVar2;
  TokenFactory *this_00;
  bool bVar3;
  RangeToken *pRVar4;
  long lVar5;
  int i;
  long lVar6;
  bool bVar7;
  bool bVar8;
  undefined2 *puVar9;
  
  if ((this->super_RangeFactory).fRangesCreated == false) {
    if ((this->super_RangeFactory).fKeywordsInitialized == false) {
      (*(this->super_RangeFactory)._vptr_RangeFactory[2])(this);
    }
    this_00 = rangeTokMap->fTokenFactory;
    lVar6 = 0;
    puVar9 = &fgBlockNames;
    bVar8 = false;
    bVar7 = false;
    do {
      pRVar4 = TokenFactory::createRange(this_00,false);
      (*(pRVar4->super_Token)._vptr_Token[0xc])
                (pRVar4,(ulong)(uint)(&blockRanges)[lVar6 * 2],
                 (ulong)(uint)(&DAT_00354e74)[lVar6 * 2]);
      bVar3 = !bVar7;
      bVar7 = true;
      if (bVar3) {
        if (lVar6 * 100 == -0x70) {
LAB_002364bf:
          (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0xfff0,0xfffd);
          bVar7 = true;
        }
        else {
          lVar5 = 0;
          do {
            psVar1 = (short *)((long)puVar9 + lVar5);
            if (*psVar1 == 0) {
              if (*(short *)((long)&fgBlockIsSpecials + lVar5) == 0) goto LAB_002364bf;
              break;
            }
            psVar2 = (short *)((long)&fgBlockIsSpecials + lVar5);
            lVar5 = lVar5 + 2;
          } while (*psVar1 == *psVar2);
          bVar7 = false;
        }
      }
      if (bVar8) {
LAB_0023653d:
        bVar8 = true;
      }
      else {
        if (lVar6 * 100 == -0x50) {
LAB_00236515:
          (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0xf0000,0xffffd);
          (*(pRVar4->super_Token)._vptr_Token[0xc])(pRVar4,0x100000,0x10fffd);
          goto LAB_0023653d;
        }
        lVar5 = 0;
        do {
          psVar1 = (short *)((long)puVar9 + lVar5);
          if (*psVar1 == 0) {
            if (*(short *)((long)&fgBlockIsPrivateUse + lVar5) == 0) goto LAB_00236515;
            break;
          }
          psVar2 = (short *)((long)&fgBlockIsPrivateUse + lVar5);
          lVar5 = lVar5 + 2;
        } while (*psVar1 == *psVar2);
        bVar8 = false;
      }
      if (pRVar4->fMap == (int *)0x0) {
        RangeToken::doCreateMap(pRVar4);
      }
      RangeTokenMap::setRangeToken(rangeTokMap,&fgBlockNames + lVar6 * 0x32,pRVar4,false);
      pRVar4 = RangeToken::complementRanges(pRVar4,this_00,XMLPlatformUtils::fgMemoryManager);
      if (pRVar4->fMap == (int *)0x0) {
        RangeToken::doCreateMap(pRVar4);
      }
      RangeTokenMap::setRangeToken(rangeTokMap,&fgBlockNames + lVar6 * 0x32,pRVar4,true);
      lVar6 = lVar6 + 1;
      puVar9 = puVar9 + 0x32;
    } while (lVar6 != 0x5d);
    (this->super_RangeFactory).fRangesCreated = true;
  }
  return;
}

Assistant:

void BlockRangeFactory::buildRanges(RangeTokenMap *rangeTokMap) {

    if (fRangesCreated)
        return;

    if (!fKeywordsInitialized) {
        initializeKeywordMap(rangeTokMap);
    }

    TokenFactory* tokFactory = rangeTokMap->getTokenFactory();

    //for performance, once the desired specials and private use are found
    //don't need to compareString anymore
    bool foundSpecial = false;
    bool foundPrivate = false;

    for (int i=0; i < BLOCKNAMESIZE; i++) {
        RangeToken* tok = tokFactory->createRange();
        tok->addRange(blockRanges[i*2], blockRanges[(i*2)+1]);

        if (!foundSpecial && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsSpecials)) {
            tok->addRange(0xFFF0, 0xFFFD);
            foundSpecial = true;
        }
        if (!foundPrivate && XMLString::equals((XMLCh*)fgBlockNames[i] , (XMLCh*) fgBlockIsPrivateUse)) {
            tok->addRange(0xF0000, 0xFFFFD);
            tok->addRange(0x100000, 0x10FFFD);
            foundPrivate = true;
        }

        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok);
        tok = RangeToken::complementRanges(tok, tokFactory);
        // Build the internal map.
        tok->createMap();
        rangeTokMap->setRangeToken(fgBlockNames[i], tok , true);
    }

    fRangesCreated = true;
}